

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonehash.cpp
# Opt level: O2

void __thiscall
asmjit::v1_14::ZoneHashBase::_rehash
          (ZoneHashBase *this,ZoneAllocator *allocator,uint32_t primeIndex)

{
  ZoneHashBase ZVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ZoneHashBase *p;
  undefined8 *puVar5;
  void *pvVar6;
  ulong uVar7;
  undefined8 *puVar8;
  ulong uVar9;
  
  if (0x80 < primeIndex) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zonehash.cpp"
               ,0xab,"primeIndex < ASMJIT_ARRAY_SIZE(ZoneHash_primeArray)");
  }
  uVar7 = (ulong)primeIndex;
  uVar2 = *(uint *)(ZoneHash_primeArray + uVar7 * 8);
  p = *(ZoneHashBase **)this;
  pvVar6 = ZoneAllocator::allocZeroed(allocator,(ulong)uVar2 * 8);
  if (pvVar6 != (void *)0x0) {
    uVar3 = *(uint *)(this + 0x10);
    *(void **)this = pvVar6;
    *(uint *)(this + 0x10) = uVar2;
    *(int *)(this + 0x14) = (int)(long)((double)uVar2 * 0.9);
    uVar4 = *(uint *)(ZoneHash_primeArray + uVar7 * 8 + 4);
    *(uint *)(this + 0x18) = uVar4;
    ZVar1 = *(ZoneHashBase *)(ZoneHash_primeShift + uVar7);
    this[0x1c] = ZVar1;
    this[0x1d] = SUB41(primeIndex,0);
    for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
      puVar8 = *(undefined8 **)(p + uVar7 * 8);
      while (puVar8 != (undefined8 *)0x0) {
        puVar5 = (undefined8 *)*puVar8;
        uVar9 = (ulong)(*(uint *)(puVar8 + 1) -
                       (int)((ulong)*(uint *)(puVar8 + 1) * (ulong)uVar4 >> ((byte)ZVar1 & 0x3f)) *
                       uVar2);
        *puVar8 = *(undefined8 *)((long)pvVar6 + uVar9 * 8);
        *(undefined8 **)((long)pvVar6 + uVar9 * 8) = puVar8;
        puVar8 = puVar5;
      }
    }
    if (p != this + 0x20) {
      ZoneAllocator::release(allocator,p,(ulong)uVar3 << 3);
      return;
    }
  }
  return;
}

Assistant:

void ZoneHashBase::_rehash(ZoneAllocator* allocator, uint32_t primeIndex) noexcept {
  ASMJIT_ASSERT(primeIndex < ASMJIT_ARRAY_SIZE(ZoneHash_primeArray));
  uint32_t newCount = ZoneHash_primeArray[primeIndex].prime;

  ZoneHashNode** oldData = _data;
  ZoneHashNode** newData = reinterpret_cast<ZoneHashNode**>(
    allocator->allocZeroed(size_t(newCount) * sizeof(ZoneHashNode*)));

  // We can still store nodes into the table, but it will degrade.
  if (ASMJIT_UNLIKELY(newData == nullptr))
    return;

  uint32_t i;
  uint32_t oldCount = _bucketsCount;

  _data = newData;
  _bucketsCount = newCount;
  _bucketsGrow = uint32_t(newCount * 0.9);
  _rcpValue = ZoneHash_primeArray[primeIndex].rcp;
  _rcpShift = ZoneHash_primeShift[primeIndex];
  _primeIndex = uint8_t(primeIndex);

  for (i = 0; i < oldCount; i++) {
    ZoneHashNode* node = oldData[i];
    while (node) {
      ZoneHashNode* next = node->_hashNext;
      uint32_t hashMod = _calcMod(node->_hashCode);

      node->_hashNext = newData[hashMod];
      newData[hashMod] = node;
      node = next;
    }
  }

  if (oldData != _embedded)
    allocator->release(oldData, oldCount * sizeof(ZoneHashNode*));
}